

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode verify_header(Curl_easy *data,char *hd,size_t hdlen)

{
  void *pvVar1;
  char *ptr;
  SingleRequest *k;
  size_t hdlen_local;
  char *hd_local;
  Curl_easy *data_local;
  
  pvVar1 = memchr(hd,0,hdlen);
  if (pvVar1 == (void *)0x0) {
    if ((data->req).headerline < 2) {
      data_local._4_4_ = CURLE_OK;
    }
    else if ((((*hd == ' ') || (*hd == '\t')) && (2 < (data->req).headerline)) ||
            (pvVar1 = memchr(hd,0x3a,hdlen), pvVar1 != (void *)0x0)) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf(data,"Header without colon");
      data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
    }
  }
  else {
    Curl_failf(data,"Nul byte in header");
    data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode verify_header(struct Curl_easy *data,
                              const char *hd, size_t hdlen)
{
  struct SingleRequest *k = &data->req;
  char *ptr = memchr(hd, 0x00, hdlen);
  if(ptr) {
    /* this is bad, bail out */
    failf(data, "Nul byte in header");
    return CURLE_WEIRD_SERVER_REPLY;
  }
  if(k->headerline < 2)
    /* the first "header" is the status-line and it has no colon */
    return CURLE_OK;
  if(((hd[0] == ' ') || (hd[0] == '\t')) && k->headerline > 2)
    /* line folding, cannot happen on line 2 */
    ;
  else {
    ptr = memchr(hd, ':', hdlen);
    if(!ptr) {
      /* this is bad, bail out */
      failf(data, "Header without colon");
      return CURLE_WEIRD_SERVER_REPLY;
    }
  }
  return CURLE_OK;
}